

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

void __thiscall Fl_Menu_::setonly(Fl_Menu_ *this,Fl_Menu_Item *item)

{
  uint uVar1;
  Fl_Menu_Item *pFVar2;
  int *piVar3;
  Fl_Menu_Item *pFVar4;
  
  pFVar2 = first_submenu_item(item,this->menu_);
  if (pFVar2 != (Fl_Menu_Item *)0x0) {
    uVar1 = item->flags;
    item->flags = uVar1 | 0xc;
    if (-1 < (char)uVar1) {
      piVar3 = &item[1].flags;
      do {
        if (((Fl_Menu_Item *)(piVar3 + -8))->text == (char *)0x0) break;
        uVar1 = *piVar3;
        if ((uVar1 & 8) == 0) break;
        *piVar3 = uVar1 & 0xfffffffb;
        piVar3 = piVar3 + 0xe;
      } while (-1 < (char)uVar1);
    }
    while ((((pFVar4 = item + -1, pFVar2 <= pFVar4 && (pFVar4->text != (char *)0x0)) &&
            ((item[-1].flags & 0x80) == 0)) && ((item[-1].flags & 8U) != 0))) {
      item[-1].flags = item[-1].flags & 0xfffffffb;
      item = pFVar4;
    }
  }
  return;
}

Assistant:

void Fl_Menu_::setonly(Fl_Menu_Item* item) {
  // find the first item of the (sub)menu containing item
  Fl_Menu_Item* first = first_submenu_item(item, menu_);
  if (!first) return; // item does not belong to our menu
  item->flags |= FL_MENU_RADIO | FL_MENU_VALUE;
  Fl_Menu_Item* j;
  for (j = item; ; ) {	// go down
    if (j->flags & FL_MENU_DIVIDER) break; // stop on divider lines
    j++;
    if (!j->text || !j->radio()) break; // stop after group
    j->clear();
  }
  for (j = item-1; j>=first; j--) { // go up
    //DEBUG printf("GO UP: WORKING ON: item='%s', flags=%x\n", j->text, j->flags);
    if (!j->text || (j->flags&FL_MENU_DIVIDER) || !j->radio()) break;
    j->clear();
  }
}